

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_order_entropy.cpp
# Opt level: O0

variables_map * parse_cmdargs(int argc,char **argv)

{
  char *pcVar1;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar2;
  variables_map *__a;
  size_type sVar3;
  ostream *poVar4;
  undefined4 in_ESI;
  variables_map *in_RDI;
  required_option *e;
  error *e_1;
  options_description desc;
  variables_map *vm;
  variables_map *in_stack_fffffffffffffe10;
  key_type *in_stack_fffffffffffffe18;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  *in_stack_fffffffffffffe20;
  allocator<char> *in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  allocator<char> *__s;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  allocator<char> local_149;
  string local_148 [32];
  undefined8 local_128;
  undefined8 uStack_120;
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *ext;
  int style;
  options_description *in_stack_fffffffffffffef8;
  char **in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff0c;
  undefined8 local_e0 [3];
  allocator<char> local_c1;
  string local_c0 [32];
  options_description local_a0 [135];
  byte local_19;
  undefined4 local_c;
  
  local_19 = 0;
  local_c = in_ESI;
  boost::program_options::variables_map::variables_map(in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),in_stack_fffffffffffffe48
             ,in_stack_fffffffffffffe40);
  boost::program_options::options_description::options_description
            (local_a0,local_c0,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator(&local_c1);
  local_e0[0] = boost::program_options::options_description::add_options();
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)local_e0,"help,h");
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,"text,t");
  ptVar2 = boost::program_options::value<std::__cxx11::string>();
  ptVar2 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::required(ptVar2);
  boost::program_options::options_description_easy_init::operator()
            (pcVar1,(value_semantic *)"input,i",(char *)ptVar2);
  local_128 = 0;
  uStack_120 = 0;
  ext = (function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
         *)0x0;
  style = 0;
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::function1((function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               *)0x17ee12);
  boost::program_options::parse_command_line<char>
            (in_stack_ffffffffffffff0c,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,style,ext
            );
  boost::program_options::store((basic_parsed_options *)&stack0xfffffffffffffef8,in_RDI,false);
  boost::program_options::basic_parsed_options<char>::~basic_parsed_options
            ((basic_parsed_options<char> *)0x17ee65);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1((function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)0x17ee72);
  __a = in_RDI + 0x10;
  __s = &local_149;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(local_c,in_stack_fffffffffffffe50),(char *)__s,(allocator<char> *)__a);
  sVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator(&local_149);
  if (sVar3 != 0) {
    poVar4 = (ostream *)boost::program_options::operator<<((ostream *)&std::cout,local_a0);
    std::operator<<(poVar4,"\n");
    exit(0);
  }
  boost::program_options::notify(in_RDI);
  local_19 = 1;
  boost::program_options::options_description::~options_description
            ((options_description *)in_stack_fffffffffffffe10);
  if ((local_19 & 1) == 0) {
    boost::program_options::variables_map::~variables_map(in_stack_fffffffffffffe10);
  }
  return in_RDI;
}

Assistant:

po::variables_map parse_cmdargs(int argc, char const* argv[])
{
    po::variables_map vm;
    po::options_description desc("Allowed options");
    // clang-format off
    desc.add_options()
        ("help,h", "produce help message")
        ("text,t", "text input (default is uint32_t binary)")
        ("input,i",po::value<std::string>()->required(), "the input dir");
    // clang-format on
    try {
        po::store(po::parse_command_line(argc, argv, desc), vm);
        if (vm.count("help")) {
            std::cout << desc << "\n";
            exit(EXIT_SUCCESS);
        }
        po::notify(vm);
    } catch (const po::required_option& e) {
        std::cout << desc;
        std::cerr << "Missing required option: " << e.what() << std::endl;
        exit(EXIT_FAILURE);
    } catch (po::error& e) {
        std::cout << desc;
        std::cerr << "Error parsing cmdargs: " << e.what() << std::endl;
        exit(EXIT_FAILURE);
    }

    return vm;
}